

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

BlockEntry * __thiscall mkvparser::Segment::GetBlock(Segment *this,CuePoint *cp,TrackPosition *tp)

{
  Cluster **ppCVar1;
  Cluster **ppCVar2;
  bool bVar3;
  Cluster **ppCVar4;
  Cluster *pCluster;
  BlockEntry *pBVar5;
  Cluster **ppCVar6;
  long lVar7;
  
  ppCVar4 = this->m_clusters;
  ppCVar1 = ppCVar4 + this->m_clusterCount + this->m_clusterPreloadCount;
  ppCVar6 = ppCVar1;
  if (ppCVar4 < ppCVar1) {
    do {
      ppCVar2 = (Cluster **)
                ((long)ppCVar4 +
                (((long)ppCVar6 - (long)ppCVar4 >> 3) - ((long)ppCVar6 - (long)ppCVar4 >> 0x3f) &
                0xfffffffffffffffeU) * 4);
      if (ppCVar1 <= ppCVar2) {
        __assert_fail("k < jj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x875,
                      "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                     );
      }
      pCluster = *ppCVar2;
      if (pCluster == (Cluster *)0x0) {
        __assert_fail("pCluster",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x878,
                      "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                     );
      }
      lVar7 = pCluster->m_element_start - pCluster->m_pSegment->m_start;
      if (lVar7 < 0) {
        __assert_fail("pos >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1ac6,"long long mkvparser::Cluster::GetPosition() const");
      }
      if (lVar7 < tp->m_pos) {
        ppCVar4 = ppCVar2 + 1;
      }
      else {
        ppCVar6 = ppCVar2;
        if (lVar7 <= tp->m_pos) goto LAB_0012744c;
      }
    } while (ppCVar4 < ppCVar6);
  }
  if (ppCVar4 != ppCVar6) {
    __assert_fail("i == j",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x889,
                  "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                 );
  }
  pCluster = Cluster::Create(this,-1,tp->m_pos);
  if (pCluster != (Cluster *)0x0) {
    lVar7 = (long)ppCVar6 - (long)this->m_clusters;
    bVar3 = PreloadCluster(this,pCluster,lVar7 >> 3);
    if (bVar3) {
      if (this->m_clusters == (Cluster **)0x0) {
        __assert_fail("m_clusters",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x896,
                      "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                     );
      }
      if (this->m_clusterPreloadCount < 1) {
        __assert_fail("m_clusterPreloadCount > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x897,
                      "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                     );
      }
      if (*(Cluster **)((long)this->m_clusters + lVar7) != pCluster) {
        __assert_fail("m_clusters[idx] == pCluster",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x898,
                      "const BlockEntry *mkvparser::Segment::GetBlock(const CuePoint &, const CuePoint::TrackPosition &)"
                     );
      }
LAB_0012744c:
      pBVar5 = Cluster::GetEntry(pCluster,cp,tp);
      return pBVar5;
    }
    Cluster::~Cluster(pCluster);
    operator_delete(pCluster);
  }
  return (BlockEntry *)0x0;
}

Assistant:

const BlockEntry* Segment::GetBlock(const CuePoint& cp,
                                    const CuePoint::TrackPosition& tp) {
  Cluster** const ii = m_clusters;
  Cluster** i = ii;

  const long count = m_clusterCount + m_clusterPreloadCount;

  Cluster** const jj = ii + count;
  Cluster** j = jj;

  while (i < j) {
    // INVARIANT:
    //[ii, i) < pTP->m_pos
    //[i, j) ?
    //[j, jj)  > pTP->m_pos

    Cluster** const k = i + (j - i) / 2;
    assert(k < jj);

    Cluster* const pCluster = *k;
    assert(pCluster);

    // const long long pos_ = pCluster->m_pos;
    // assert(pos_);
    // const long long pos = pos_ * ((pos_ < 0) ? -1 : 1);

    const long long pos = pCluster->GetPosition();
    assert(pos >= 0);

    if (pos < tp.m_pos)
      i = k + 1;
    else if (pos > tp.m_pos)
      j = k;
    else
      return pCluster->GetEntry(cp, tp);
  }

  assert(i == j);
  // assert(Cluster::HasBlockEntries(this, tp.m_pos));

  Cluster* const pCluster = Cluster::Create(this, -1, tp.m_pos);  //, -1);
  if (pCluster == NULL)
    return NULL;

  const ptrdiff_t idx = i - m_clusters;

  if (!PreloadCluster(pCluster, idx)) {
    delete pCluster;
    return NULL;
  }
  assert(m_clusters);
  assert(m_clusterPreloadCount > 0);
  assert(m_clusters[idx] == pCluster);

  return pCluster->GetEntry(cp, tp);
}